

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O2

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_escape_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
          (case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
           *__return_storage_ptr__,
          match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               end,case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   out)

{
  char *pcVar1;
  __copy_move<false,false,std::random_access_iterator_tag> *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  undefined1 cond;
  int iVar5;
  const_reference pvVar6;
  char *pcVar7;
  unsigned_long line;
  size_type index;
  sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  bool cond_00;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  tmp;
  
  uVar2 = tmp._16_8_;
  pcVar7 = cur->_M_current;
  tmp._16_8_ = out._16_8_;
  uVar3 = tmp._16_8_;
  if (pcVar7 == end._M_current) {
    cVar4 = '\\';
    goto LAB_00134395;
  }
  pcVar1 = pcVar7 + 1;
  cur->_M_current = pcVar1;
  cVar4 = *pcVar7;
  switch(cVar4) {
  case 'a':
    cVar4 = '\a';
    break;
  case 'b':
  case 'd':
  case 'g':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'm':
  case 'o':
  case 'p':
  case 'q':
  case 's':
  case 'w':
    goto switchD_00134358_caseD_62;
  case 'c':
    detail::ensure_(pcVar1 != end._M_current,error_escape,"unexpected end of format found",
                    "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                    ,0x4e2);
    cVar4 = (**(code **)(**(long **)(this + 0x80) + 0x20))
                      (*(long **)(this + 0x80),0x61,0x7a,(int)*cur->_M_current);
    cond = true;
    if (cVar4 == '\0') {
      cond = (**(code **)(**(long **)(this + 0x80) + 0x20))
                       (*(long **)(this + 0x80),0x41,0x5a,(int)*cur->_M_current);
    }
    detail::ensure_((bool)cond,error_escape,
                    "invalid escape control letter; must be one of a-z or A-Z",
                    "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                    ,0x4e9);
    cVar4 = *cur->_M_current % ' ';
    numeric::convdetail::
    generic_range_checker<boost::numeric::conversion_traits<unsigned_char,_int>,_boost::numeric::convdetail::LT_Zero<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::convdetail::GT_HiT<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::xpressive::detail::char_overflow_handler_>
    ::validate_range((int)cVar4);
    tmp.out_ = out.out_;
    tmp.traits_ = out.traits_;
    out.next_ = op_none;
    detail::
    case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
    ::operator=(&tmp,cVar4);
    cur->_M_current = cur->_M_current + 1;
    goto LAB_0013439a;
  case 'e':
    cVar4 = '\x1b';
    numeric::convdetail::
    generic_range_checker<boost::numeric::conversion_traits<unsigned_char,_int>,_boost::numeric::convdetail::LT_Zero<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::convdetail::GT_HiT<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::xpressive::detail::char_overflow_handler_>
    ::validate_range(0x1b);
    break;
  case 'f':
    cVar4 = '\f';
    break;
  case 'l':
    out.next_ = op_lower;
    goto LAB_0013439a;
  case 'n':
    cVar4 = '\n';
    break;
  case 'r':
    cVar4 = '\r';
    break;
  case 't':
    cVar4 = '\t';
    break;
  case 'u':
    out.next_ = op_upper;
    goto LAB_0013439a;
  case 'v':
    cVar4 = '\v';
    break;
  case 'x':
    detail::ensure_(pcVar1 != end._M_current,error_escape,"unexpected end of format found",
                    "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                    ,0x4cf);
    pcVar7 = cur->_M_current;
    if (*pcVar7 == '{') {
      cur->_M_current = pcVar7 + 1;
      detail::ensure_(pcVar7 + 1 != end._M_current,error_escape,"unexpected end of format found",
                      "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                      ,0x4d2);
      pcVar7 = cur->_M_current;
      iVar5 = detail::
              toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                        (cur,end,*(traits<char> **)(this + 0x80),0x10,0xffff);
      numeric::convdetail::
      generic_range_checker<boost::numeric::conversion_traits<unsigned_char,_int>,_boost::numeric::convdetail::LT_Zero<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::convdetail::GT_HiT<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::xpressive::detail::char_overflow_handler_>
      ::validate_range(iVar5);
      tmp.out_ = out.out_;
      tmp.traits_ = out.traits_;
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=(&tmp,(char)iVar5);
      pcVar1 = cur->_M_current;
      cond_00 = false;
      if ((pcVar1 != end._M_current) && (cond_00 = false, (long)pcVar1 - (long)pcVar7 == 4)) {
        cur->_M_current = pcVar1 + 1;
        cond_00 = *pcVar1 == '}';
      }
      pcVar7 = "invalid hex escape : must be \\x { HexDigit HexDigit HexDigit HexDigit }";
      line = 0x4d6;
    }
    else {
      iVar5 = detail::
              toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                        (cur,end,*(traits<char> **)(this + 0x80),0x10,0xff);
      numeric::convdetail::
      generic_range_checker<boost::numeric::conversion_traits<unsigned_char,_int>,_boost::numeric::convdetail::LT_Zero<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::numeric::convdetail::GT_HiT<boost::numeric::conversion_traits<unsigned_char,_int>_>,_boost::xpressive::detail::char_overflow_handler_>
      ::validate_range(iVar5);
      tmp.out_ = out.out_;
      tmp.traits_ = out.traits_;
      detail::
      case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
      ::operator=(&tmp,(char)iVar5);
      cond_00 = (long)cur->_M_current - (long)pcVar7 == 2;
      pcVar7 = "invalid hex escape : must be \\x HexDigit HexDigit";
      line = 0x4dd;
    }
    out.next_ = op_none;
    detail::ensure_(cond_00,error_escape,pcVar7,
                    "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_escape_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O2/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                    ,line);
    goto LAB_0013439a;
  default:
    if (cVar4 == 'E') {
      out.rest_ = op_none;
      goto LAB_0013439a;
    }
    if (cVar4 == 'L') {
      out.rest_ = op_lower;
      goto LAB_0013439a;
    }
    if (cVar4 == 'U') {
      out.rest_ = op_upper;
      goto LAB_0013439a;
    }
switchD_00134358_caseD_62:
    pcVar7 = (char *)**(long **)(this + 0x80);
    tmp._16_8_ = uVar2;
    iVar5 = (**(code **)(pcVar7 + 0x28))(*(long **)(this + 0x80),(int)cVar4,10);
    if (0 < iVar5) {
      iVar5 = (**(code **)(**(long **)(this + 0x80) + 0x28))(*(long **)(this + 0x80),(int)cVar4,10);
      this_01 = (sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(this + 8);
      index = (size_type)iVar5;
      pvVar6 = detail::
               sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_01,index);
      if (pvVar6->matched == true) {
        pvVar6 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_01,index);
        this_00 = (__copy_move<false,false,std::random_access_iterator_tag> *)
                  (pvVar6->
                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ).first._M_current;
        pvVar6 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_01,index);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<char_const*,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
                  (&tmp,this_00,
                   (pvVar6->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current,pcVar7,out);
        out.next_ = tmp.next_;
        out.rest_ = tmp.rest_;
        out.out_ = (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )tmp.out_.container;
        out.traits_ = tmp.traits_;
      }
      goto LAB_0013439a;
    }
  }
LAB_00134395:
  tmp.traits_ = out.traits_;
  tmp.out_ = out.out_;
  out.next_ = op_none;
  tmp._16_8_ = uVar3;
  detail::
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  ::operator=(&tmp,cVar4);
LAB_0013439a:
  __return_storage_ptr__->next_ = out.next_;
  __return_storage_ptr__->rest_ = out.rest_;
  (__return_storage_ptr__->out_).container = out.out_.container;
  __return_storage_ptr__->traits_ = out.traits_;
  return __return_storage_ptr__;
}

Assistant:

OutputIterator format_escape_
    (
        ForwardIterator &cur
      , ForwardIterator end
      , OutputIterator out
    ) const
    {
        using namespace regex_constants;
        ForwardIterator tmp;
        // define an unsigned type the same size as char_type
        typedef typename boost::uint_t<CHAR_BIT * sizeof(char_type)>::least uchar_t;
        BOOST_MPL_ASSERT_RELATION(sizeof(uchar_t), ==, sizeof(char_type));
        typedef numeric::conversion_traits<uchar_t, int> converstion_traits;
        numeric::converter<int, uchar_t, converstion_traits, detail::char_overflow_handler_> converter;

        if(cur == end)
        {
            *out++ = BOOST_XPR_CHAR_(char_type, '\\');
            return out;
        }

        char_type ch = *cur++;
        switch(ch)
        {
        case BOOST_XPR_CHAR_(char_type, 'a'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\a');
            break;

        case BOOST_XPR_CHAR_(char_type, 'e'):
            *out++ = converter(27);
            break;

        case BOOST_XPR_CHAR_(char_type, 'f'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\f');
            break;

        case BOOST_XPR_CHAR_(char_type, 'n'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\n');
            break;

        case BOOST_XPR_CHAR_(char_type, 'r'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\r');
            break;

        case BOOST_XPR_CHAR_(char_type, 't'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\t');
            break;

        case BOOST_XPR_CHAR_(char_type, 'v'):
            *out++ = BOOST_XPR_CHAR_(char_type, '\v');
            break;

        case BOOST_XPR_CHAR_(char_type, 'x'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            if(BOOST_XPR_CHAR_(char_type, '{') == *cur)
            {
                BOOST_XPR_ENSURE_(++cur != end, error_escape, "unexpected end of format found");
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xffff));
                BOOST_XPR_ENSURE_(4 == std::distance(tmp, cur) && cur != end && BOOST_XPR_CHAR_(char_type, '}') == *cur++
                  , error_escape, "invalid hex escape : must be \\x { HexDigit HexDigit HexDigit HexDigit }");
            }
            else
            {
                tmp = cur;
                *out++ = converter(detail::toi(cur, end, *this->traits_, 16, 0xff));
                BOOST_XPR_ENSURE_(2 == std::distance(tmp, cur), error_escape
                  , "invalid hex escape : must be \\x HexDigit HexDigit");
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'c'):
            BOOST_XPR_ENSURE_(cur != end, error_escape, "unexpected end of format found");
            BOOST_XPR_ENSURE_
            (
                this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'a'), BOOST_XPR_CHAR_(char_type, 'z'), *cur)
             || this->traits_->in_range(BOOST_XPR_CHAR_(char_type, 'A'), BOOST_XPR_CHAR_(char_type, 'Z'), *cur)
              , error_escape
              , "invalid escape control letter; must be one of a-z or A-Z"
            );
            // Convert to character according to ECMA-262, section 15.10.2.10:
            *out++ = converter(*cur % 32);
            ++cur;
            break;

        case BOOST_XPR_CHAR_(char_type, 'l'):
            if(!set_transform(out, detail::op_lower, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'l');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'L'):
            if(!set_transform(out, detail::op_lower, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'L');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'u'):
            if(!set_transform(out, detail::op_upper, detail::scope_next))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'u');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'U'):
            if(!set_transform(out, detail::op_upper, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'U');
            }
            break;

        case BOOST_XPR_CHAR_(char_type, 'E'):
            if(!set_transform(out, detail::op_none, detail::scope_rest))
            {
                *out++ = BOOST_XPR_CHAR_(char_type, 'E');
            }
            break;

        default:
            // BUGBUG what about backreferences like \12 ?
            if(0 < this->traits_->value(ch, 10))
            {
                int sub = this->traits_->value(ch, 10);
                if(this->sub_matches_[ sub ].matched)
                    out = std::copy(this->sub_matches_[ sub ].first, this->sub_matches_[ sub ].second, out);
            }
            else
            {
                *out++ = ch;
            }
            break;
        }

        return out;
    }